

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O1

void * __thiscall
absl::debugging_internal::ElfMemImage::GetSymAddr(ElfMemImage *this,Elf64_Sym *sym)

{
  void *pvVar1;
  
  if ((ushort)(sym->st_shndx + 0x100) < 0x101) {
    pvVar1 = (void *)sym->st_value;
  }
  else {
    if (sym->st_value <= this->link_base_) {
      GetSymAddr();
    }
    pvVar1 = (void *)((sym->st_value - this->link_base_) + (long)this->ehdr_);
  }
  return pvVar1;
}

Assistant:

const void *ElfMemImage::GetSymAddr(const ElfW(Sym) *sym) const {
  if (sym->st_shndx == SHN_UNDEF || sym->st_shndx >= SHN_LORESERVE) {
    // Symbol corresponds to "special" (e.g. SHN_ABS) section.
    return reinterpret_cast<const void *>(sym->st_value);
  }
  ABSL_RAW_CHECK(link_base_ < sym->st_value, "symbol out of range");
  return GetTableElement<char>(ehdr_, 0, 1, sym->st_value - link_base_);
}